

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O2

void __thiscall Generation::commit(Generation *this)

{
  bool bVar1;
  unsigned_long value;
  unsigned_long local_78;
  File genFile;
  MutexLocker lock;
  string local_28;
  
  if (this->isToken == true) {
    MutexLocker::MutexLocker(&lock,this->genMutex);
    std::__cxx11::string::string((string *)&local_28,(string *)&this->path);
    File::File(&genFile,&local_28,this->umask,true,true,true,false);
    std::__cxx11::string::~string((string *)&local_28);
    bVar1 = File::isValid(&genFile);
    if (bVar1) {
      File::lock(&genFile,true);
      bVar1 = File::isEmpty(&genFile);
      if (bVar1) {
        value = this->currentValue + 1 + (ulong)(this->currentValue == 0xffffffffffffffff);
        this->currentValue = value;
        this->pendingUpdate = false;
        File::writeULong(&genFile,value);
        File::unlock(&genFile);
      }
      else {
        local_78 = 0;
        bVar1 = File::readULong(&genFile,&local_78);
        if (bVar1) {
          bVar1 = File::seek(&genFile,0);
        }
        else {
          bVar1 = false;
        }
        if (this->pendingUpdate == true) {
          local_78 = local_78 + 1 + (ulong)(local_78 == 0xffffffffffffffff);
        }
        if (bVar1 != false) {
          bVar1 = File::writeULong(&genFile,local_78);
          if (bVar1) {
            this->currentValue = local_78;
            this->pendingUpdate = false;
          }
        }
        File::unlock(&genFile);
      }
    }
    File::~File(&genFile);
    MutexLocker::~MutexLocker(&lock);
  }
  return;
}

Assistant:

void Generation::commit()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask, true, true, true, false);

		if (!genFile.isValid())
		{
			return;
		}

		genFile.lock();

		if (genFile.isEmpty())
		{
			currentValue++;

			if (currentValue == 0)
			{
				currentValue++;
			}

			pendingUpdate = false;

			(void) genFile.writeULong(currentValue);

			genFile.unlock();

			return;
		}

		unsigned long onDisk = 0;

		bool bOK = true;

		bOK = bOK && genFile.readULong(onDisk);
		bOK = bOK && genFile.seek(0L);

		if (pendingUpdate)
		{
			onDisk++;

			if (onDisk == 0)
			{
				onDisk++;
			}
		}

		bOK = bOK && genFile.writeULong(onDisk);

		if (bOK)
		{
			currentValue = onDisk;

			pendingUpdate = false;
		}

		genFile.unlock();
	}
}